

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O3

void __thiscall irr::video::COpenGLDriver::uploadClipPlane(COpenGLDriver *this,u32 index)

{
  undefined8 uVar1;
  pointer pSVar2;
  double local_28;
  double dStack_20;
  double local_18;
  double dStack_10;
  
  pSVar2 = (this->UserClipPlanes).m_data.
           super__Vector_base<irr::video::COpenGLDriver::SUserClipPlane,_std::allocator<irr::video::COpenGLDriver::SUserClipPlane>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = *(undefined8 *)&pSVar2[index].Plane.Normal;
  local_28 = (double)(float)uVar1;
  dStack_20 = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)((long)&pSVar2[index].Plane.Normal + 8);
  local_18 = (double)(float)uVar1;
  dStack_10 = (double)(float)((ulong)uVar1 >> 0x20);
  glClipPlane(index + 0x3000,&local_28);
  return;
}

Assistant:

void COpenGLDriver::uploadClipPlane(u32 index)
{
	// opengl needs an array of doubles for the plane equation
	GLdouble clip_plane[4];
	clip_plane[0] = UserClipPlanes[index].Plane.Normal.X;
	clip_plane[1] = UserClipPlanes[index].Plane.Normal.Y;
	clip_plane[2] = UserClipPlanes[index].Plane.Normal.Z;
	clip_plane[3] = UserClipPlanes[index].Plane.D;
	glClipPlane(GL_CLIP_PLANE0 + index, clip_plane);
}